

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool __thiscall
TimesAll<0,_0,_0>::propagate_z
          (TimesAll<0,_0,_0> *this,int64_t x_min,int64_t x_max,int64_t y_min,int64_t y_max)

{
  IntVar *pIVar1;
  uint uVar2;
  int iVar3;
  Clause *pCVar4;
  int64_t m_v_1;
  long lVar5;
  long lVar6;
  long lVar7;
  int64_t m_v;
  long lVar8;
  Clause *pCVar9;
  long lVar10;
  Clause *c;
  Clause *local_38;
  
  lVar6 = y_min * x_min;
  lVar5 = x_min * y_max;
  lVar7 = y_min * x_max;
  lVar10 = y_max * x_max;
  lVar8 = lVar6;
  if (lVar5 < lVar6) {
    lVar8 = lVar5;
  }
  if (lVar7 < lVar8) {
    lVar8 = lVar7;
  }
  if (lVar10 < lVar8) {
    lVar8 = lVar10;
  }
  if (-500000000 < lVar8) {
    if (so.lazy) {
      local_38 = (Clause *)malloc(0x1c);
      *(uint *)local_38 = 0x502;
      vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38);
      pCVar4 = local_38;
      uVar2 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
      if (*(uint *)pCVar4 < 0x200) goto LAB_001accb1;
      *(uint *)(pCVar4 + 1) = uVar2;
      iVar3 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      if (*(uint *)pCVar4 < 0x300) goto LAB_001accb1;
      pCVar4[1].data[0].x = iVar3;
      uVar2 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      if (*(uint *)pCVar4 < 0x400) goto LAB_001accb1;
      *(uint *)(pCVar4 + 2) = uVar2;
      iVar3 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      if (*(uint *)pCVar4 < 0x500) goto LAB_001accb1;
      pCVar4[2].data[0].x = iVar3;
    }
    else {
      pCVar4 = (Clause *)0x0;
    }
    pIVar1 = (this->z).var;
    if ((pIVar1->min).v < lVar8) {
      pCVar9 = (Clause *)0x0;
      if (so.lazy == false) {
        pCVar4 = pCVar9;
      }
      iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xe])(pIVar1,lVar8,pCVar4,1);
      if ((char)iVar3 == '\0') goto LAB_001acc9f;
    }
  }
  if (lVar6 - lVar5 != 0 && lVar5 <= lVar6) {
    lVar5 = lVar6;
  }
  if (lVar5 <= lVar7) {
    lVar5 = lVar7;
  }
  if (lVar5 <= lVar10) {
    lVar5 = lVar10;
  }
  pCVar9 = (Clause *)0x1;
  if (lVar5 < 500000000) {
    if (so.lazy == true) {
      local_38 = (Clause *)malloc(0x1c);
      *(uint *)local_38 = 0x502;
      vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38);
      pCVar4 = local_38;
      uVar2 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
      if (*(uint *)pCVar4 < 0x200) {
LAB_001accb1:
        abort();
      }
      *(uint *)(pCVar4 + 1) = uVar2;
      iVar3 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      if (*(uint *)pCVar4 < 0x300) goto LAB_001accb1;
      pCVar4[1].data[0].x = iVar3;
      uVar2 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      if (*(uint *)pCVar4 < 0x400) goto LAB_001accb1;
      *(uint *)(pCVar4 + 2) = uVar2;
      iVar3 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      if (*(uint *)pCVar4 < 0x500) goto LAB_001accb1;
      pCVar4[2].data[0].x = iVar3;
    }
    else {
      pCVar4 = (Clause *)0x0;
    }
    pIVar1 = (this->z).var;
    if (lVar5 < (pIVar1->max).v) {
      pCVar9 = (Clause *)0x0;
      if (so.lazy == false) {
        pCVar4 = pCVar9;
      }
      iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xf])(pIVar1,lVar5,pCVar4,1);
      if ((char)iVar3 == '\0') goto LAB_001acc9f;
    }
    pCVar9 = (Clause *)0x1;
  }
LAB_001acc9f:
  return SUB81(pCVar9,0);
}

Assistant:

bool propagate_z(const int64_t x_min, const int64_t x_max, const int64_t y_min,
									 const int64_t y_max) {
		// Computing all possible extreme points of x * y
		const int64_t prod_min_min = x_min * y_min;
		const int64_t prod_min_max = x_min * y_max;
		const int64_t prod_max_min = x_max * y_min;
		const int64_t prod_max_max = x_max * y_max;

		// New lower bound on z
		int64_t z_min_new = std::min(prod_min_min, prod_min_max);
		z_min_new = std::min(z_min_new, prod_max_min);
		z_min_new = std::min(z_min_new, prod_max_max);

		if (z_min_new > IntVar::min_limit) {
			// TODO Better explanation
			Clause* reason = nullptr;
			if (so.lazy) {
				reason = Reason_new(5);
				(*reason)[1] = x.getMinLit();
				(*reason)[2] = x.getMaxLit();
				(*reason)[3] = y.getMinLit();
				(*reason)[4] = y.getMaxLit();
			}
			setDom(z, setMin, z_min_new, reason);
		}

		// New upper bound on z
		int64_t z_max_new = std::max(prod_min_min, prod_min_max);
		z_max_new = std::max(z_max_new, prod_max_min);
		z_max_new = std::max(z_max_new, prod_max_max);

		if (z_max_new < IntVar::max_limit) {
			// TODO Better explanation
			Clause* reason = nullptr;
			if (so.lazy) {
				reason = Reason_new(5);
				(*reason)[1] = x.getMinLit();
				(*reason)[2] = x.getMaxLit();
				(*reason)[3] = y.getMinLit();
				(*reason)[4] = y.getMaxLit();
			}
			setDom(z, setMax, z_max_new, reason);
		}

		return true;
	}